

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ReduceSumLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducesum(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x4f6) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4f6;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    ReduceSumLayerParams::ReduceSumLayerParams(this_00.reducesum_);
    (this->layer_).reducesum_ = (ReduceSumLayerParams *)this_00;
  }
  return (ReduceSumLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceSumLayerParams* NeuralNetworkLayer::mutable_reducesum() {
  if (!has_reducesum()) {
    clear_layer();
    set_has_reducesum();
    layer_.reducesum_ = new ::CoreML::Specification::ReduceSumLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceSum)
  return layer_.reducesum_;
}